

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Node * __thiscall JSON::Parser::parse(Parser *this)

{
  initializer_list<JSON::Node> __l;
  Node *local_220;
  allocator<JSON::Node> local_1e9;
  Node *local_1e8;
  Node local_1e0;
  iterator local_180;
  size_type local_178;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_170;
  string local_158 [32];
  undefined1 local_138 [8];
  Node node;
  Node body;
  allocator local_61;
  string local_60 [32];
  Token local_40;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  Token::Token(&local_40,START_F,(string *)local_60,0,0);
  Token::operator=(&this->currentToken,&local_40);
  Token::~Token(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Token::operator=(&this->lastToken,&this->currentToken);
  this->pos = 0;
  next(this);
  parseNode((Node *)&node.children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,this);
  std::__cxx11::string::string(local_158,(string *)NodeType::Root_abi_cxx11_);
  local_1e8 = &local_1e0;
  Node::Node(local_1e8,
             (Node *)&node.children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_180 = &local_1e0;
  local_178 = 1;
  std::allocator<JSON::Node>::allocator(&local_1e9);
  __l._M_len = local_178;
  __l._M_array = local_180;
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&local_170,__l,&local_1e9);
  Node::Node((Node *)local_138,(string *)local_158,&local_170,0,this->length);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_170);
  std::allocator<JSON::Node>::~allocator(&local_1e9);
  local_220 = (Node *)&local_180;
  do {
    local_220 = local_220 + -1;
    Node::~Node(local_220);
  } while (local_220 != &local_1e0);
  std::__cxx11::string::~string(local_158);
  Node::operator=(&this->ast,(Node *)local_138);
  if ((this->currentToken).type != END_F) {
    unexpected(this,&this->currentToken);
  }
  Node::~Node((Node *)local_138);
  Node::~Node((Node *)&node.children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  return &this->ast;
}

Assistant:

Node &Parser::parse() {
        currentToken = Token(START_F, "", 0, 0);
        lastToken = currentToken;
        pos = 0;

        next();
        Node body = parseNode();
        Node node(NodeType::Root, vector<Node>{body}, 0, length);
        ast = node;
        if (currentToken.type != END_F) {
            unexpected(currentToken);
        }
        return ast;
    }